

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  uint uVar6;
  long lVar7;
  void *__ptr;
  double *pdVar8;
  size_t sVar9;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  LONGLONG LVar10;
  ulong uVar11;
  uint uVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  size_t sVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  size_t __nmemb;
  ulong uVar27;
  int *piVar28;
  double dVar29;
  double dVar30;
  long local_e0;
  double dStack_b0;
  long local_88;
  size_t local_80;
  size_t local_78;
  uint local_6c;
  long local_68;
  
  local_e0 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    lVar7 = ny * nx;
    if (nullcheck == 0) {
      if (0 < lVar7) {
        dVar29 = 0.0;
        lVar19 = 0;
        dVar30 = 0.0;
        do {
          dVar5 = (double)array[lVar19];
          dVar30 = dVar30 + dVar5;
          dVar29 = dVar29 + dVar5 * dVar5;
          lVar19 = lVar19 + 1;
          local_e0 = lVar7;
        } while (lVar7 - lVar19 != 0);
        goto LAB_001b1853;
      }
LAB_001b1896:
      dVar30 = 0.0;
      local_e0 = 0;
      dVar29 = 0.0;
    }
    else {
      if (lVar7 < 1) goto LAB_001b1896;
      dVar29 = 0.0;
      local_e0 = 0;
      dVar30 = 0.0;
      lVar19 = 0;
      do {
        if (array[lVar19] != nullvalue) {
          dVar5 = (double)array[lVar19];
          local_e0 = local_e0 + 1;
          dVar30 = dVar30 + dVar5;
          dVar29 = dVar29 + dVar5 * dVar5;
        }
        lVar19 = lVar19 + 1;
      } while (lVar7 - lVar19 != 0);
LAB_001b1853:
      if (local_e0 < 2) {
        if (local_e0 != 1) goto LAB_001b1896;
        dVar29 = 0.0;
        local_e0 = 1;
      }
      else {
        dVar30 = dVar30 / (double)local_e0;
        dVar29 = dVar29 / (double)local_e0 - dVar30 * dVar30;
        if (dVar29 < 0.0) {
          dVar29 = sqrt(dVar29);
        }
        else {
          dVar29 = SQRT(dVar29);
        }
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = local_e0;
    }
    if (mean != (double *)0x0) {
      *mean = dVar30;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar29;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar29 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,4);
      if (__ptr != (void *)0x0) {
        pdVar8 = (double *)calloc(ny,8);
        if (pdVar8 != (double *)0x0) {
          if (ny < 1) {
            dVar29 = 0.0;
          }
          else {
            sVar9 = 0;
            lVar7 = 0;
            piVar28 = array;
            do {
              lVar19 = 0;
              if (nullcheck == 0) {
LAB_001b19ea:
                if ((lVar19 != nx) && (lVar24 = lVar19 + 1, lVar24 < nx)) {
                  uVar11 = 0;
                  iVar16 = array[lVar7 * nx + lVar19];
                  do {
                    if ((nullcheck != 0) && (lVar24 < nx)) {
                      while (piVar28[lVar24] == nullvalue) {
                        lVar24 = lVar24 + 1;
                        if (nx == lVar24) goto LAB_001b1a51;
                      }
                    }
                    if (lVar24 == nx) break;
                    iVar1 = array[lVar7 * nx + lVar24];
                    *(int *)((long)__ptr + uVar11 * 4) = iVar16 - iVar1;
                    uVar11 = uVar11 + 1;
                    lVar24 = lVar24 + 1;
                    iVar16 = iVar1;
                  } while (lVar24 < nx);
LAB_001b1a51:
                  if (1 < uVar11) {
                    dVar29 = 0.0;
                    dVar30 = 0.0;
                    uVar20 = 0;
                    do {
                      dVar5 = (double)*(int *)((long)__ptr + uVar20 * 4);
                      dVar30 = dVar30 + dVar5;
                      dVar29 = dVar29 + dVar5 * dVar5;
                      uVar20 = uVar20 + 1;
                    } while (uVar11 != uVar20);
                    dVar30 = dVar30 / (double)(long)uVar11;
                    dVar29 = dVar29 / (double)(long)uVar11 - dVar30 * dVar30;
                    if (dVar29 < 0.0) {
                      dVar29 = sqrt(dVar29);
                    }
                    else {
                      dVar29 = SQRT(dVar29);
                    }
                    if (0.0 < dVar29) {
                      iVar16 = 0;
                      do {
                        if ((long)uVar11 < 1) {
                          if (uVar11 == 0) break;
                          uVar27 = 0;
LAB_001b1b11:
                          dVar30 = 0.0;
                          dVar29 = 0.0;
                          uVar11 = uVar27;
                        }
                        else {
                          uVar20 = 0;
                          uVar27 = 0;
                          do {
                            iVar1 = *(int *)((long)__ptr + uVar20 * 4);
                            if (ABS((double)iVar1 - dVar30) < dVar29 * 5.0) {
                              if ((long)uVar27 < (long)uVar20) {
                                *(int *)((long)__ptr + uVar27 * 4) = iVar1;
                              }
                              uVar27 = uVar27 + 1;
                            }
                            uVar20 = uVar20 + 1;
                          } while (uVar11 != uVar20);
                          if (uVar27 == uVar11) break;
                          if ((long)uVar27 < 1) goto LAB_001b1b11;
                          dVar29 = 0.0;
                          dVar30 = 0.0;
                          uVar11 = 0;
                          do {
                            dVar5 = (double)*(int *)((long)__ptr + uVar11 * 4);
                            dVar30 = dVar30 + dVar5;
                            dVar29 = dVar29 + dVar5 * dVar5;
                            uVar11 = uVar11 + 1;
                          } while (uVar27 != uVar11);
                          if (uVar27 == 1) {
                            dVar29 = 0.0;
                            uVar11 = 1;
                          }
                          else {
                            dVar30 = dVar30 / (double)(long)uVar27;
                            dVar29 = dVar29 / (double)(long)uVar27 - dVar30 * dVar30;
                            uVar11 = uVar27;
                            if (dVar29 < 0.0) {
                              dVar29 = sqrt(dVar29);
                            }
                            else {
                              dVar29 = SQRT(dVar29);
                            }
                          }
                        }
                        iVar16 = iVar16 + 1;
                      } while (iVar16 != 3);
                    }
                    pdVar8[sVar9] = dVar29;
                    sVar9 = sVar9 + 1;
                  }
                }
              }
              else {
                do {
                  if (piVar28[lVar19] != nullvalue) goto LAB_001b19ea;
                  lVar19 = lVar19 + 1;
                } while (nx != lVar19);
              }
              lVar7 = lVar7 + 1;
              piVar28 = piVar28 + nx;
            } while (lVar7 != ny);
            if (sVar9 == 0) {
              dVar29 = 0.0;
            }
            else if (sVar9 == 1) {
              dVar29 = *pdVar8;
            }
            else {
              qsort(pdVar8,sVar9,8,FnCompare_double);
              dVar29 = (*(double *)
                         ((long)pdVar8 +
                         ((sVar9 - ((long)(sVar9 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                       *(double *)
                        ((long)pdVar8 + (sVar9 - ((long)sVar9 >> 0x3f) & 0xfffffffffffffffe) * 4)) *
                       0.5;
            }
          }
          dVar29 = dVar29 * 0.70710678;
          free(pdVar8);
          free(__ptr);
          goto LAB_001b1d77;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar29 = 0.0;
    }
LAB_001b1d77:
    *noise1 = dVar29;
  }
  if ((minvalue == (int *)0x0 && maxvalue == (int *)0x0) && noise3 == (double *)0x0)
  goto LAB_001b25db;
  lVar7 = 1;
  sVar9 = ny;
  if (nx < 9) {
    sVar9 = 1;
    lVar7 = ny;
  }
  __nmemb = lVar7 * nx;
  if ((long)__nmemb < 9) {
    dVar29 = 0.0;
    dStack_b0 = 0.0;
    dVar30 = 0.0;
    if ((long)__nmemb < 1) {
      uVar14 = 0x80000000;
      uVar25 = 0x7fffffff;
      local_e0 = 0;
      dVar29 = 0.0;
      dStack_b0 = 0.0;
    }
    else {
      uVar25 = 0x7fffffff;
      uVar14 = 0x80000000;
      lVar7 = 0;
      local_e0 = 0;
      do {
        uVar26 = array[lVar7];
        if ((nullcheck == 0) || (uVar26 != nullvalue)) {
          if ((int)uVar26 < (int)uVar25) {
            uVar25 = uVar26;
          }
          if ((int)uVar14 < (int)uVar26) {
            uVar14 = uVar26;
          }
          local_e0 = local_e0 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (__nmemb - lVar7 != 0);
    }
  }
  else {
    pdVar8 = (double *)calloc(__nmemb,8);
    if (pdVar8 != (double *)0x0) {
      arr = (double *)calloc(__nmemb,8);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb,8);
        if (arr_00 == (double *)0x0) {
          free(pdVar8);
          pdVar8 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(sVar9,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar8);
            free(arr);
            pdVar8 = arr_00;
          }
          else {
            __base = (double *)calloc(sVar9,8);
            if (__base == (double *)0x0) {
              free(pdVar8);
              free(arr);
              free(arr_00);
              pdVar8 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(sVar9,8);
              if (__base_00 != (double *)0x0) {
                dVar30 = 0.0;
                if ((long)sVar9 < 1) {
                  dVar29 = 0.0;
                  dStack_b0 = 0.0;
                  uVar14 = 0x80000000;
                  uVar25 = 0x7fffffff;
                  local_e0 = 0;
                }
                else {
                  uVar26 = 0x7fffffff;
                  uVar25 = 0x7fffffff;
                  uVar15 = 0x80000000;
                  uVar14 = 0x80000000;
                  sVar13 = 0;
                  local_78 = 0;
                  local_80 = 0;
                  lVar7 = 0;
                  piVar28 = array;
                  do {
                    local_e0 = lVar7;
                    if (nullcheck == 0) {
                      sVar22 = 0;
LAB_001b1f2b:
                      if (sVar22 != __nmemb) {
                        lVar19 = sVar13 * __nmemb;
                        uVar12 = array[lVar19 + sVar22];
                        bVar3 = (int)uVar12 < (int)uVar25;
                        uVar25 = uVar26;
                        if (bVar3) {
                          uVar25 = uVar12;
                        }
                        bVar3 = (int)uVar14 < (int)uVar12;
                        uVar14 = uVar15;
                        if (bVar3) {
                          uVar14 = uVar12;
                        }
                        sVar22 = sVar22 + 1;
                        local_e0 = lVar7 + 1;
                        uVar26 = uVar25;
                        uVar15 = uVar14;
                        if ((long)sVar22 < (long)__nmemb && nullcheck != 0) {
                          do {
                            if (piVar28[sVar22] != nullvalue) goto LAB_001b1f8a;
                            sVar22 = sVar22 + 1;
                          } while (__nmemb - sVar22 != 0);
                        }
                        else {
LAB_001b1f8a:
                          if (sVar22 != __nmemb) {
                            uVar18 = array[lVar19 + sVar22];
                            if ((int)uVar18 < (int)uVar25) {
                              uVar25 = uVar18;
                            }
                            if ((int)uVar14 < (int)uVar18) {
                              uVar14 = uVar18;
                            }
                            sVar22 = sVar22 + 1;
                            local_e0 = lVar7 + 2;
                            uVar26 = uVar25;
                            uVar15 = uVar14;
                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar22)) {
LAB_001b1fca:
                              if (sVar22 != __nmemb) {
                                uVar17 = array[lVar19 + sVar22];
                                if ((int)uVar17 < (int)uVar25) {
                                  uVar25 = uVar17;
                                }
                                if ((int)uVar14 < (int)uVar17) {
                                  uVar14 = uVar17;
                                }
                                sVar22 = sVar22 + 1;
                                local_e0 = lVar7 + 3;
                                uVar26 = uVar25;
                                uVar15 = uVar14;
                                if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar22)) {
LAB_001b200a:
                                  if (sVar22 != __nmemb) {
                                    uVar21 = array[lVar19 + sVar22];
                                    if ((int)uVar21 < (int)uVar25) {
                                      uVar25 = uVar21;
                                    }
                                    if ((int)uVar14 < (int)uVar21) {
                                      uVar14 = uVar21;
                                    }
                                    sVar22 = sVar22 + 1;
                                    local_e0 = lVar7 + 4;
                                    uVar26 = uVar25;
                                    uVar15 = uVar14;
                                    if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar22)) {
LAB_001b2051:
                                      if (sVar22 != __nmemb) {
                                        uVar6 = array[lVar19 + sVar22];
                                        if ((int)uVar6 < (int)uVar25) {
                                          uVar25 = uVar6;
                                        }
                                        if ((int)uVar14 < (int)uVar6) {
                                          uVar14 = uVar6;
                                        }
                                        sVar22 = sVar22 + 1;
                                        local_e0 = lVar7 + 5;
                                        uVar26 = uVar25;
                                        uVar15 = uVar14;
                                        if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar22)) {
LAB_001b2092:
                                          if (sVar22 != __nmemb) {
                                            uVar23 = array[lVar19 + sVar22];
                                            if ((int)uVar23 < (int)uVar25) {
                                              uVar25 = uVar23;
                                            }
                                            if ((int)uVar14 < (int)uVar23) {
                                              uVar14 = uVar23;
                                            }
                                            sVar22 = sVar22 + 1;
                                            local_e0 = lVar7 + 6;
                                            uVar26 = uVar25;
                                            uVar15 = uVar14;
                                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar22))
                                            {
LAB_001b210b:
                                              if (sVar22 != __nmemb) {
                                                local_6c = array[lVar19 + sVar22];
                                                if ((int)local_6c < (int)uVar25) {
                                                  uVar25 = local_6c;
                                                }
                                                if ((int)uVar14 < (int)local_6c) {
                                                  uVar14 = local_6c;
                                                }
                                                sVar22 = sVar22 + 1;
                                                local_e0 = lVar7 + 7;
                                                uVar26 = uVar25;
                                                uVar15 = uVar14;
                                                if ((nullcheck == 0) ||
                                                   ((long)__nmemb <= (long)sVar22)) {
LAB_001b2160:
                                                  if (sVar22 != __nmemb) {
                                                    uVar2 = array[lVar19 + sVar22];
                                                    local_e0 = lVar7 + 8;
                                                    if ((int)uVar2 < (int)uVar25) {
                                                      uVar25 = uVar2;
                                                    }
                                                    if ((int)uVar14 < (int)uVar2) {
                                                      uVar14 = uVar2;
                                                    }
                                                    sVar22 = sVar22 + 1;
                                                    uVar26 = uVar25;
                                                    uVar15 = uVar14;
                                                    if ((long)sVar22 < (long)__nmemb) {
                                                      local_88 = 0;
                                                      local_68 = 0;
                                                      do {
                                                        uVar26 = uVar2;
                                                        if ((nullcheck != 0) &&
                                                           ((long)sVar22 < (long)__nmemb)) {
                                                          while (piVar28[sVar22] == nullvalue) {
                                                            sVar22 = sVar22 + 1;
                                                            if (__nmemb - sVar22 == 0)
                                                            goto LAB_001b2342;
                                                          }
                                                        }
                                                        if (sVar22 == __nmemb) break;
                                                        uVar2 = array[lVar19 + sVar22];
                                                        if ((int)uVar2 < (int)uVar25) {
                                                          uVar25 = uVar2;
                                                        }
                                                        if ((int)uVar14 < (int)uVar2) {
                                                          uVar14 = uVar2;
                                                        }
                                                        if ((uVar6 ^ uVar23) != 0 ||
                                                            (uVar23 ^ local_6c) != 0) {
                                                          uVar20 = (long)(int)uVar6 -
                                                                   (long)(int)local_6c;
                                                          uVar11 = -uVar20;
                                                          if (0 < (long)uVar20) {
                                                            uVar11 = uVar20;
                                                          }
                                                          pdVar8[local_68] =
                                                               (double)(uVar11 & 0xffffffff);
                                                          local_68 = local_68 + 1;
                                                        }
                                                        if (((uVar6 ^ uVar23) == 0 &&
                                                            (uVar21 == uVar6 && uVar17 == uVar21))
                                                            && (uVar23 ^ local_6c) == 0) {
                                                          local_e0 = local_e0 + 1;
                                                        }
                                                        else {
                                                          dVar30 = (double)((long)(int)uVar6 * 2 -
                                                                           ((long)(int)local_6c +
                                                                           (long)(int)uVar17));
                                                          dVar29 = (double)-(long)dVar30;
                                                          if (0 < (long)dVar30) {
                                                            dVar29 = dVar30;
                                                          }
                                                          arr[local_88] = dVar29;
                                                          dVar30 = (double)((long)(int)uVar12 +
                                                                            (long)(int)uVar6 * 6 +
                                                                            ((long)(int)local_6c +
                                                                            (long)(int)uVar17) * -4
                                                                           + (long)(int)uVar2);
                                                          dVar29 = (double)-(long)dVar30;
                                                          if (0 < (long)dVar30) {
                                                            dVar29 = dVar30;
                                                          }
                                                          arr_00[local_88] = dVar29;
                                                          local_88 = local_88 + 1;
                                                        }
                                                        sVar22 = sVar22 + 1;
                                                        uVar12 = uVar18;
                                                        uVar18 = uVar17;
                                                        uVar17 = uVar21;
                                                        uVar21 = uVar6;
                                                        uVar6 = uVar23;
                                                        uVar23 = local_6c;
                                                        local_6c = uVar26;
                                                      } while ((long)sVar22 < (long)__nmemb);
LAB_001b2342:
                                                      local_e0 = local_e0 + local_88;
                                                      uVar26 = uVar25;
                                                      uVar15 = uVar14;
                                                      if (local_88 != 0) {
                                                        if (local_88 == 1) {
                                                          if (local_68 == 1) {
                                                            __ptr_00[local_80] =
                                                                 (double)(long)*pdVar8;
                                                            local_80 = local_80 + 1;
                                                          }
                                                          __base[local_78] = (double)(long)*arr;
                                                          dVar29 = *arr_00;
                                                        }
                                                        else {
                                                          iVar16 = (int)local_88;
                                                          if (1 < local_68) {
                                                            LVar10 = quick_select_longlong
                                                                               ((LONGLONG *)pdVar8,
                                                                                iVar16);
                                                            __ptr_00[local_80] = (double)LVar10;
                                                            local_80 = local_80 + 1;
                                                          }
                                                          LVar10 = quick_select_longlong
                                                                             ((LONGLONG *)arr,iVar16
                                                                             );
                                                          __base[local_78] = (double)LVar10;
                                                          dVar29 = (double)quick_select_longlong
                                                                                     ((LONGLONG *)
                                                                                      arr_00,iVar16)
                                                          ;
                                                        }
                                                        __base_00[local_78] = (double)(long)dVar29;
                                                        local_78 = local_78 + 1;
                                                      }
                                                    }
                                                  }
                                                }
                                                else {
                                                  do {
                                                    if (piVar28[sVar22] != nullvalue)
                                                    goto LAB_001b2160;
                                                    sVar22 = sVar22 + 1;
                                                  } while (__nmemb - sVar22 != 0);
                                                }
                                              }
                                            }
                                            else {
                                              do {
                                                if (piVar28[sVar22] != nullvalue) goto LAB_001b210b;
                                                sVar22 = sVar22 + 1;
                                              } while (__nmemb - sVar22 != 0);
                                            }
                                          }
                                        }
                                        else {
                                          do {
                                            if (piVar28[sVar22] != nullvalue) goto LAB_001b2092;
                                            sVar22 = sVar22 + 1;
                                          } while (__nmemb - sVar22 != 0);
                                        }
                                      }
                                    }
                                    else {
                                      do {
                                        if (piVar28[sVar22] != nullvalue) goto LAB_001b2051;
                                        sVar22 = sVar22 + 1;
                                      } while (__nmemb - sVar22 != 0);
                                    }
                                  }
                                }
                                else {
                                  do {
                                    if (piVar28[sVar22] != nullvalue) goto LAB_001b200a;
                                    sVar22 = sVar22 + 1;
                                  } while (__nmemb - sVar22 != 0);
                                }
                              }
                            }
                            else {
                              do {
                                if (piVar28[sVar22] != nullvalue) goto LAB_001b1fca;
                                sVar22 = sVar22 + 1;
                              } while (__nmemb - sVar22 != 0);
                            }
                          }
                        }
                      }
                    }
                    else {
                      sVar22 = 0;
                      do {
                        if (piVar28[sVar22] != nullvalue) goto LAB_001b1f2b;
                        sVar22 = sVar22 + 1;
                      } while (__nmemb - sVar22 != 0);
                    }
                    sVar13 = sVar13 + 1;
                    piVar28 = piVar28 + __nmemb;
                    lVar7 = local_e0;
                  } while (sVar13 != sVar9);
                  if (local_78 == 0) {
                    dVar29 = 0.0;
                    dStack_b0 = 0.0;
                  }
                  else if (local_78 == 1) {
                    dVar29 = *__base;
                    dStack_b0 = *__base_00;
                  }
                  else {
                    qsort(__base,local_78,8,FnCompare_double);
                    qsort(__base_00,local_78,8,FnCompare_double);
                    lVar19 = ((local_78 - ((long)(local_78 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe)
                             * 4;
                    lVar7 = (local_78 - ((long)local_78 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                    dVar29 = (*(double *)((long)__base + lVar7) + *(double *)((long)__base + lVar19)
                             ) * 0.5;
                    dStack_b0 = (*(double *)((long)__base_00 + lVar7) +
                                *(double *)((long)__base_00 + lVar19)) * 0.5;
                  }
                  dVar30 = 0.0;
                  if (local_80 != 0) {
                    if (local_80 == 1) {
                      dVar30 = *__ptr_00;
                    }
                    else {
                      auVar4._8_4_ = SUB84(dStack_b0,0);
                      auVar4._0_8_ = dVar29;
                      auVar4._12_4_ = (int)((ulong)dStack_b0 >> 0x20);
                      qsort(__ptr_00,local_80,8,FnCompare_double);
                      dStack_b0 = auVar4._8_8_;
                      dVar30 = (*(double *)
                                 ((long)__ptr_00 +
                                 ((local_80 - ((long)(local_80 - 1) >> 0x3f)) - 1 &
                                 0xfffffffffffffffe) * 4) +
                               *(double *)
                                ((long)__ptr_00 +
                                (local_80 - ((long)local_80 >> 0x3f) & 0xfffffffffffffffe) * 4)) *
                               0.5;
                    }
                  }
                }
                dVar30 = dVar30 * 1.0483579;
                dVar29 = dVar29 * 0.6052697;
                dStack_b0 = dStack_b0 * 0.1772048;
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar8);
                goto LAB_001b2599;
              }
              free(pdVar8);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar8 = __base;
            }
          }
        }
      }
      free(pdVar8);
    }
    *status = 0x71;
    dVar29 = 0.0;
    dStack_b0 = 0.0;
    dVar30 = 0.0;
    uVar25 = 0;
    uVar14 = 0;
  }
LAB_001b2599:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = local_e0;
  }
  if (minvalue != (int *)0x0) {
    *minvalue = uVar25;
  }
  if (maxvalue != (int *)0x0) {
    *maxvalue = uVar14;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar30;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar29;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dStack_b0;
  }
LAB_001b25db:
  return *status;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}